

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# UnitTest.cpp
# Opt level: O3

void initNames(void)

{
  uint32_t uVar1;
  uint uVar2;
  ulong uVar3;
  int i;
  long lVar4;
  
  lVar4 = 0;
  do {
    uVar1 = rand32();
    uVar2 = uVar1 & 0x1f;
    std::__cxx11::basic_string<char,_std::char_traits<char>,_guts::Allocator<char>_>::resize
              (names_abi_cxx11_ + lVar4,(ulong)uVar2,'\0');
    if (uVar2 != 0) {
      uVar3 = 0;
      do {
        uVar1 = rand32();
        names_abi_cxx11_[lVar4]._M_dataplus._M_p[uVar3] =
             ((char)uVar1 - ((char)(uVar1 / 0x1a) * '\x19' + (char)(uVar1 / 0x1a))) + 'A';
        uVar3 = uVar3 + 1;
      } while (uVar2 != uVar3);
    }
    lVar4 = lVar4 + 1;
  } while (lVar4 != 100000);
  return;
}

Assistant:

void initNames()
{
    for (int i = 0; i != INT_RANGE; ++i)
    {
        int length = rand32() % 32;
        names[i].resize(length);
        for (int j = 0; j != length; ++j)
        {
            names[i][j] = 'A' + (rand32() % 26);
        }
    }
}